

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

StringPtr * __thiscall
kj::
Table<kj::TreeMap<kj::String,_int>::Entry,_kj::TreeIndex<kj::TreeMap<kj::String,_int>::Callbacks>_>
::insert(Table<kj::TreeMap<kj::String,_int>::Entry,_kj::TreeIndex<kj::TreeMap<kj::String,_int>::Callbacks>_>
         *this,StringPtr *row)

{
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 row_00;
  size_t pos;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar1;
  StringPtr *pSVar2;
  StringPtr SVar3;
  Maybe<unsigned_long> local_38;
  undefined1 local_28 [8];
  NullableValue<unsigned_long> existing;
  StringPtr *row_local;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this_local;
  
  existing.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)row;
  pos = Vector<kj::TreeMap<kj::String,_int>::Entry>::size
                  ((Vector<kj::TreeMap<kj::String,_int>::Entry> *)this);
  row_00 = existing.field_1;
  SVar3 = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&maxValue);
  Impl<0UL,_false>::insert
            ((Impl<0UL,_false> *)&local_38,
             (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)
             this,pos,(StringPtr *)row_00,(uint)SVar3.content.ptr);
  other = _::readMaybe<unsigned_long>(&local_38);
  _::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_28,other);
  Maybe<unsigned_long>::~Maybe(&local_38);
  puVar1 = _::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_28);
  if (puVar1 != (unsigned_long *)0x0) {
    _::throwDuplicateTableRow();
  }
  pSVar2 = mv<kj::TreeMap<kj::String,int>::Entry>((StringPtr *)existing.field_1);
  pSVar2 = Vector<kj::TreeMap<kj::String,int>::Entry>::add<kj::TreeMap<kj::String,int>::Entry>
                     ((Vector<kj::TreeMap<kj::String,int>::Entry> *)this,pSVar2);
  _::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_28);
  return pSVar2;
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  KJ_IF_MAYBE(existing, Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }